

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_BREATH(effect_handler_context_t *context)

{
  wchar_t type;
  wchar_t wVar1;
  anon_enum_32 aVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint32_t uVar5;
  monster *mon;
  monster *pmVar6;
  wchar_t flg;
  wchar_t rad;
  int iVar7;
  ulong uVar8;
  source origin;
  loc target;
  
  wVar4 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  type = context->subtype;
  target = (loc)loc(-1,-1);
  rad = context->radius;
  wVar1 = context->other;
  uVar8 = 0x14;
  if (L'\x14' < wVar1) {
    uVar8 = (ulong)(uint)wVar1;
  }
  if (rad == L'\0') {
    rad = (wchar_t)z_info->max_range;
  }
  aVar2 = (context->origin).what;
  iVar7 = 4;
  flg = L'Ѱ';
  if (aVar2 == SRC_PLAYER) {
    msgt(projections[type].msgt,"You breathe %s.",projections[type].desc);
    if ((context->dir == L'\x05') && (_Var3 = target_okay(), _Var3)) {
      target_get((loc_conflict *)&target);
    }
    else {
      target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[context->dir]);
    }
  }
  else {
    flg = L'Ѱ';
    if (aVar2 == SRC_MONSTER) {
      mon = cave_monster(cave,(context->origin).which.monster);
      pmVar6 = monster_target_monster((effect_handler_context_t_conflict *)context);
      wVar4 = monster_effect_level(mon,L'\x02');
      iVar7 = 100;
      for (; wVar4 != L'\0'; wVar4 = wVar4 + L'\xffffffff') {
        iVar7 = (iVar7 * 0x3c) / 100;
      }
      uVar5 = Rand_div(100);
      if ((int)uVar5 < iVar7) {
        if (pmVar6 == (monster *)0x0) {
          _Var3 = monster_is_decoyed(mon);
          if (_Var3) {
            target = cave_find_decoy(cave);
          }
          else {
            target.x = (player->grid).x;
            target.y = (player->grid).y;
          }
        }
        else {
          target.x = (pmVar6->grid).x;
          target.y = (pmVar6->grid).y;
        }
      }
      else {
        uVar5 = Rand_div(9);
        target = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid[(long)(int)uVar5 + 1]);
      }
      wVar4 = breath_dam(type,(int)mon->hp);
      _Var3 = monster_is_powerful(mon);
      iVar7 = (uint)_Var3 * 2 + 4;
      flg = L'౰';
    }
  }
  if (wVar1 < L'<') {
    iVar7 = (int)((uint)(iVar7 * 0x3c) / uVar8);
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var3 = project(origin,rad,target,wVar4,type,flg,(wchar_t)uVar8,(uint8_t)iVar7,context->obj);
  if (_Var3) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_BREATH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int type = context->subtype;

	struct loc target = loc(-1, -1);

	/* Diameter of source starts at 4, so full strength up to 3 grids from
	 * the breather. */
	int diameter_of_source = 4;

	/* Minimum breath width is 20 degrees */
	int degrees_of_arc = MAX(context->other, 20);

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Distance breathed generally has no fixed limit. */
	int rad = context->radius ? context->radius : z_info->max_range;

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		int conf_level, accuracy = 100;

		flg |= PROJECT_PLAY;

		conf_level = monster_effect_level(mon, MON_TMD_CONF);
		while (conf_level) {
			accuracy *= (100 - CONF_RANDOM_CHANCE);
			accuracy /= 100;
			conf_level--;
		}

		if (randint1(100) > accuracy) {
			/* Confused direction. */
			int dir = randint1(9);

			target = loc_sum(mon->grid, ddgrid[dir]);
		} else if (t_mon) {
			/* Target monster. */
			target = t_mon->grid;
		} else {
			/* Target player. */
			if (monster_is_decoyed(mon)) {
				target = cave_find_decoy(cave);
			} else {
				target = player->grid;
			}
		}

		dam = breath_dam(type, mon->hp);

		/* Powerful monster */
		if (monster_is_powerful(mon)) {
			/* Breath is now full strength at 5 grids */
			diameter_of_source *= 3;
			diameter_of_source /= 2;
		}
	} else if (context->origin.what == SRC_PLAYER) {
		msgt(projections[type].msgt, "You breathe %s.", projections[type].desc);

		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Adjust the diameter of the energy source */
	if (degrees_of_arc < 60) {
		/* Narrower cone means energy drops off less quickly. We now have:
		 * - 30 degree regular breath  | full strength at 7 grids
		 * - 30 degree powerful breath | full strength at 11 grids
		 * - 20 degree regular breath  | full strength at 11 grids
		 * - 20 degree powerful breath | full strength at 17 grids
		 * where grids are measured from the breather. */
		diameter_of_source = diameter_of_source * 60 / degrees_of_arc;

		/* Max */
		if (diameter_of_source > 25)
			diameter_of_source = 25;
	}

	/* Breathe at the target */
	if (project(context->origin, rad, target, dam, type, flg, degrees_of_arc,
				diameter_of_source, context->obj))
		context->ident = true;

	return true;
}